

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_data.c
# Opt level: O1

void ares_free_data(void *dataptr)

{
  undefined8 *p;
  bool bVar1;
  void *pvVar2;
  undefined8 *puVar3;
  
  do {
    if ((undefined8 *)dataptr == (undefined8 *)0x0) {
      return;
    }
    if (*(int *)((long)dataptr + -4) != 0xbead) {
switchD_0010f522_default:
      bVar1 = false;
      goto LAB_0010f591;
    }
    p = (undefined8 *)((long)dataptr + -8);
    switch(*(undefined4 *)p) {
    case 2:
    case 3:
    case 4:
    case 6:
      pvVar2 = *(void **)((long)dataptr + 8);
      dataptr = *dataptr;
      break;
    case 5:
    case 10:
      dataptr = *dataptr;
      goto LAB_0010f587;
    case 7:
      puVar3 = *dataptr;
      ares_free(*(void **)((long)dataptr + 8));
      ares_free(*(void **)((long)dataptr + 0x10));
      pvVar2 = *(void **)((long)dataptr + 0x18);
      goto LAB_0010f558;
    case 8:
      ares_free(*dataptr);
      ares_free(*(void **)((long)dataptr + 8));
      dataptr = (undefined8 *)0x0;
      goto LAB_0010f587;
    case 9:
      pvVar2 = *(void **)((long)dataptr + 0x10);
      dataptr = *dataptr;
      break;
    case 0xb:
      puVar3 = *dataptr;
      pvVar2 = *(void **)((long)dataptr + 0x10);
LAB_0010f558:
      ares_free(pvVar2);
      pvVar2 = *(void **)((long)dataptr + 0x20);
      dataptr = puVar3;
      break;
    default:
      goto switchD_0010f522_default;
    }
    ares_free(pvVar2);
LAB_0010f587:
    ares_free(p);
    bVar1 = true;
LAB_0010f591:
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void ares_free_data(void *dataptr)
{
  while (dataptr != NULL) {
    struct ares_data *ptr;
    void             *next_data = NULL;

#ifdef __INTEL_COMPILER
#  pragma warning(push)
#  pragma warning(disable : 1684)
    /* 1684: conversion from pointer to same-sized integral type */
#endif

    ptr = (void *)((char *)dataptr - offsetof(struct ares_data, data));

#ifdef __INTEL_COMPILER
#  pragma warning(pop)
#endif

    if (ptr->mark != ARES_DATATYPE_MARK) {
      return;
    }

    switch (ptr->type) {
      case ARES_DATATYPE_MX_REPLY:
        next_data = ptr->data.mx_reply.next;
        ares_free(ptr->data.mx_reply.host);
        break;

      case ARES_DATATYPE_SRV_REPLY:
        next_data = ptr->data.srv_reply.next;
        ares_free(ptr->data.srv_reply.host);
        break;

      case ARES_DATATYPE_URI_REPLY:
        next_data = ptr->data.uri_reply.next;
        ares_free(ptr->data.uri_reply.uri);
        break;

      case ARES_DATATYPE_TXT_REPLY:
      case ARES_DATATYPE_TXT_EXT:
        next_data = ptr->data.txt_reply.next;
        ares_free(ptr->data.txt_reply.txt);
        break;

      case ARES_DATATYPE_ADDR_NODE:
        next_data = ptr->data.addr_node.next;
        break;

      case ARES_DATATYPE_ADDR_PORT_NODE:
        next_data = ptr->data.addr_port_node.next;
        break;

      case ARES_DATATYPE_NAPTR_REPLY:
        next_data = ptr->data.naptr_reply.next;
        ares_free(ptr->data.naptr_reply.flags);
        ares_free(ptr->data.naptr_reply.service);
        ares_free(ptr->data.naptr_reply.regexp);
        ares_free(ptr->data.naptr_reply.replacement);
        break;

      case ARES_DATATYPE_SOA_REPLY:
        ares_free(ptr->data.soa_reply.nsname);
        ares_free(ptr->data.soa_reply.hostmaster);
        break;

      case ARES_DATATYPE_CAA_REPLY:
        next_data = ptr->data.caa_reply.next;
        ares_free(ptr->data.caa_reply.property);
        ares_free(ptr->data.caa_reply.value);
        break;

      default:
        return;
    }

    ares_free(ptr);
    dataptr = next_data;
  }
}